

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlinuxfbintegration.cpp
# Opt level: O2

void __thiscall QLinuxFbIntegration::initialize(QLinuxFbIntegration *this)

{
  char cVar1;
  int iVar2;
  QPlatformInputContext *pQVar3;
  QFbVtHandler *other;
  QPlatformScreen *pQVar4;
  long in_FS_OFFSET;
  char local_40 [24];
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = (**(code **)(*(long *)this->m_primaryScreen + 0x60))();
  if (cVar1 == '\0') {
    local_40[0] = '\x02';
    local_40[1] = '\0';
    local_40[2] = '\0';
    local_40[3] = '\0';
    local_40[0x14] = '\0';
    local_40[0x15] = '\0';
    local_40[0x16] = '\0';
    local_40[0x17] = '\0';
    local_40[4] = '\0';
    local_40[5] = '\0';
    local_40[6] = '\0';
    local_40[7] = '\0';
    local_40[8] = '\0';
    local_40[9] = '\0';
    local_40[10] = '\0';
    local_40[0xb] = '\0';
    local_40[0xc] = '\0';
    local_40[0xd] = '\0';
    local_40[0xe] = '\0';
    local_40[0xf] = '\0';
    local_40[0x10] = '\0';
    local_40[0x11] = '\0';
    local_40[0x12] = '\0';
    local_40[0x13] = '\0';
    local_28 = "default";
    QMessageLogger::warning(local_40);
  }
  else {
    pQVar4 = &this->m_primaryScreen->super_QPlatformScreen;
    if (this->m_primaryScreen == (QFbScreen *)0x0) {
      pQVar4 = (QPlatformScreen *)0x0;
    }
    QWindowSystemInterface::handleScreenAdded(pQVar4,false);
  }
  pQVar3 = (QPlatformInputContext *)QPlatformInputContextFactory::create();
  this->m_inputContext = pQVar3;
  other = (QFbVtHandler *)operator_new(0x28);
  QFbVtHandler::QFbVtHandler((QFbVtHandler *)other,(QObject *)0x0);
  QScopedPointer<QFbVtHandler,_QScopedPointerDeleter<QFbVtHandler>_>::reset
            (&this->m_vtHandler,other);
  iVar2 = qEnvironmentVariableIntValue("QT_QPA_FB_DISABLE_INPUT",(bool *)0x0);
  if (iVar2 == 0) {
    createInputHandlers(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLinuxFbIntegration::initialize()
{
    if (m_primaryScreen->initialize())
        QWindowSystemInterface::handleScreenAdded(m_primaryScreen);
    else
        qWarning("linuxfb: Failed to initialize screen");

    m_inputContext = QPlatformInputContextFactory::create();

    m_vtHandler.reset(new QFbVtHandler);

    if (!qEnvironmentVariableIntValue("QT_QPA_FB_DISABLE_INPUT"))
        createInputHandlers();
}